

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::LoadHeapArgsCached
              (JavascriptFunction *funcCallee,uint32 actualsCount,uint32 formalsCount,Var *paramAddr
              ,Var frameObj,ScriptContext *scriptContext,bool nonSimpleParamList)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *threadContext;
  undefined4 *puVar3;
  HeapArgumentsObject *argsObj_00;
  Var pvVar4;
  HeapArgumentsObject *argsObj;
  undefined1 local_58 [8];
  JsReentLock reentrancylock;
  bool nonSimpleParamList_local;
  ScriptContext *scriptContext_local;
  Var frameObj_local;
  Var *paramAddr_local;
  uint32 formalsCount_local;
  uint32 actualsCount_local;
  JavascriptFunction *funcCallee_local;
  
  reentrancylock._31_1_ = nonSimpleParamList;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_58,threadContext);
  if ((actualsCount == 0xffffffff) || (formalsCount == 0xffffffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1d26,"(actualsCount != (uint32)-1 && formalsCount != (uint32)-1)"
                                ,"Loading the arguments object in the global function?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  argsObj_00 = CreateHeapArguments(funcCallee,actualsCount,formalsCount,frameObj,scriptContext);
  pvVar4 = FillScopeObject(funcCallee,actualsCount,formalsCount,frameObj,paramAddr,
                           (PropertyIdArray *)0x0,argsObj_00,scriptContext,
                           (bool)(reentrancylock._31_1_ & 1),true);
  JsReentLock::~JsReentLock((JsReentLock *)local_58);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::LoadHeapArgsCached(JavascriptFunction *funcCallee, uint32 actualsCount, uint32 formalsCount, Var *paramAddr, Var frameObj, ScriptContext* scriptContext, bool nonSimpleParamList)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_LoadHeapArgsCached, reentrancylock, scriptContext->GetThreadContext());
        // Disregard the "this" param.
        AssertMsg(actualsCount != (uint32)-1 && formalsCount != (uint32)-1,
                  "Loading the arguments object in the global function?");

        HeapArgumentsObject *argsObj = JavascriptOperators::CreateHeapArguments(funcCallee, actualsCount, formalsCount, frameObj, scriptContext);

        return FillScopeObject(funcCallee, actualsCount, formalsCount, frameObj, paramAddr, nullptr, argsObj, scriptContext, nonSimpleParamList, true);
        JIT_HELPER_END(Op_LoadHeapArgsCached);
    }